

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall
graphics101::TextureCube::TextureCube
          (TextureCube *this,string *image_path_x_plus,string *image_path_x_minus,
          string *image_path_y_plus,string *image_path_y_minus,string *image_path_z_plus,
          string *image_path_z_minus)

{
  Texture::Texture(&this->super_Texture);
  (this->super_Texture)._vptr_Texture = (_func_int **)&PTR__TextureCube_00195230;
  std::__cxx11::string::string((string *)&this->m_image_path_x_plus,(string *)image_path_x_plus);
  std::__cxx11::string::string((string *)&this->m_image_path_x_minus,(string *)image_path_x_minus);
  std::__cxx11::string::string((string *)&this->m_image_path_y_plus,(string *)image_path_y_plus);
  std::__cxx11::string::string((string *)&this->m_image_path_y_minus,(string *)image_path_y_minus);
  std::__cxx11::string::string((string *)&this->m_image_path_z_plus,(string *)image_path_z_plus);
  std::__cxx11::string::string((string *)&this->m_image_path_z_minus,(string *)image_path_z_minus);
  (*(this->super_Texture)._vptr_Texture[3])(this);
  return;
}

Assistant:

TextureCube::TextureCube(
    const std::string& image_path_x_plus, const std::string& image_path_x_minus,
    const std::string& image_path_y_plus, const std::string& image_path_y_minus,
    const std::string& image_path_z_plus, const std::string& image_path_z_minus
    )
    : m_image_path_x_plus( image_path_x_plus ), m_image_path_x_minus( image_path_x_minus ),
    m_image_path_y_plus( image_path_y_plus ), m_image_path_y_minus( image_path_y_minus ),
    m_image_path_z_plus( image_path_z_plus ), m_image_path_z_minus( image_path_z_minus )
{
    reload();
}